

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_object.cpp
# Opt level: O0

object_ptr __thiscall mjs::new_boolean(mjs *this,object_ptr *prototype,bool val)

{
  gc_heap *args;
  undefined8 extraout_RDX;
  object_ptr oVar1;
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  gc_heap_ptr<mjs::boolean_object> o;
  bool val_local;
  object_ptr *prototype_local;
  
  o.super_gc_heap_ptr_untyped._15_1_ = val;
  args = gc_heap_ptr_untyped::heap(&prototype->super_gc_heap_ptr_untyped);
  gc_heap_ptr<mjs::object>::operator->(prototype);
  object::class_name((object *)local_40);
  gc_heap::make<mjs::boolean_object,mjs::string,mjs::gc_heap_ptr<mjs::object>const&,bool&>
            ((gc_heap *)local_30,(string *)args,(gc_heap_ptr<mjs::object> *)local_40,
             (bool *)prototype);
  string::~string((string *)local_40);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::boolean_object,void>
            ((gc_heap_ptr<mjs::object> *)this,(gc_heap_ptr<mjs::boolean_object> *)local_30);
  gc_heap_ptr<mjs::boolean_object>::~gc_heap_ptr((gc_heap_ptr<mjs::boolean_object> *)local_30);
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr new_boolean(const object_ptr& prototype, bool val) {
    auto o = prototype.heap().make<boolean_object>(prototype->class_name(), prototype, val);
    return o;
}